

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall FGLRenderer::ProcessScene(FGLRenderer *this,bool toscreen)

{
  byte bVar1;
  uint uVar2;
  subsector_t *psVar3;
  uchar *__s;
  byte *pbVar4;
  TVector2<double> local_28;
  int local_18;
  byte local_11;
  int mapsection;
  bool toscreen_local;
  FGLRenderer *this_local;
  
  local_11 = toscreen;
  _mapsection = this;
  FDrawInfo::StartDrawInfo();
  draw_dlightf = 0;
  draw_dlight = 0;
  iter_dlight = 0;
  iter_dlightf = 0;
  GLPortal::BeginScene();
  TVector2<double>::TVector2(&local_28,&ViewPos);
  psVar3 = R_PointInSubsector(&local_28);
  local_18 = (int)psVar3->mapsection;
  __s = TArray<unsigned_char,_unsigned_char>::operator[](&currentmapsection,0);
  uVar2 = TArray<unsigned_char,_unsigned_char>::Size(&currentmapsection);
  memset(__s,0,(ulong)uVar2);
  bVar1 = (byte)local_18;
  pbVar4 = TArray<unsigned_char,_unsigned_char>::operator[]
                     (&currentmapsection,(long)(local_18 >> 3));
  *pbVar4 = *pbVar4 | (byte)(1 << (bVar1 & 7));
  DrawScene(this,(uint)((local_11 & 1) == 0));
  FDrawInfo::EndDrawInfo();
  return;
}

Assistant:

void FGLRenderer::ProcessScene(bool toscreen)
{
	FDrawInfo::StartDrawInfo();
	iter_dlightf = iter_dlight = draw_dlight = draw_dlightf = 0;
	GLPortal::BeginScene();

	int mapsection = R_PointInSubsector(ViewPos)->mapsection;
	memset(&currentmapsection[0], 0, currentmapsection.Size());
	currentmapsection[mapsection>>3] |= 1 << (mapsection & 7);
	DrawScene(toscreen ? DM_MAINVIEW : DM_OFFSCREEN);
	FDrawInfo::EndDrawInfo();

}